

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int mem_equal(void *_x,void *_y,size_t len)

{
  size_t sVar1;
  byte bVar2;
  uint8_t *y;
  uint8_t *x;
  
  if (len != 0) {
    sVar1 = 0;
    bVar2 = 0;
    do {
      bVar2 = bVar2 | *(byte *)((long)_x + sVar1) ^ *(byte *)((long)_y + sVar1);
      sVar1 = sVar1 + 1;
    } while (len != sVar1);
    return (int)(bVar2 == 0);
  }
  return 1;
}

Assistant:

static int mem_equal(const void *_x, const void *_y, size_t len)
{
    const volatile uint8_t *x = _x, *y = _y;
    uint8_t t = 0;

    for (; len != 0; --len)
        t |= *x++ ^ *y++;

    return t == 0;
}